

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O2

int cpu_exec_arm(uc_struct_conflict1 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUARMState *env;
  TranslationBlock *pTVar4;
  long lVar5;
  CPUClass *pCVar6;
  CPUWatchpoint *pCVar7;
  target_ulong_conflict *ptVar8;
  _Bool _Var9;
  char cVar10;
  int iVar11;
  uint uVar12;
  tcg_target_ulong tVar13;
  target_ulong_conflict *ptVar14;
  TranslationBlock *pTVar15;
  uint uVar16;
  list_item *plVar17;
  ulong uVar18;
  long lVar19;
  anon_union_16_2_aaf24f3d_for_entry *paVar20;
  uint uVar21;
  uint cf_mask;
  target_ulong_conflict *ptVar22;
  CPUClass *pCVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  target_ulong_conflict *ptStack_80;
  uint32_t flags;
  uint local_70;
  target_ulong cs_base;
  target_ulong_conflict *local_60;
  uc_struct_conflict1 *local_58;
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar23 = cpu->cc;
  local_58 = uc;
  if (cpu->halted != 0) {
    if (pCVar23->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var9 = (*pCVar23->has_work)((CPUState_conflict *)cpu);
    if (!_Var9) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar23->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar11 = __sigsetjmp(local_58->exits + (long)local_58->nested_level * 0x19 + 0x33,0);
  unique0x10000913 = pCVar23;
  if (iVar11 != 0) {
    unique0x00012000 = cpu->cc;
  }
LAB_0051f233:
  puVar2 = cpu->uc;
  uVar16 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var9 = (*puVar2->stop_interrupt)(puVar2,uVar16);
    if (_Var9) {
      plVar17 = (list_item *)(puVar2->hook + 0xe);
      goto LAB_0051f6d1;
    }
    uVar16 = cpu->exception_index;
  }
  pCVar23 = stack0xffffffffffffff98;
  if (-1 < (int)uVar16) {
    if (0xffff < uVar16) {
      if (uVar16 == 0x10002) {
        pCVar6 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          paVar20 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->watchpoints;
          while (pCVar7 = paVar20->tqe_next, pCVar7 != (CPUWatchpoint *)0x0) {
            *(byte *)&pCVar7->flags = (byte)pCVar7->flags & 0x3f;
            paVar20 = &pCVar7->entry;
          }
        }
        (*pCVar6->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_0051f757;
    }
    plVar17 = (list_item *)puVar2->hook;
    bVar24 = false;
    while ((plVar17 = plVar17->next, plVar17 != (list_item *)0x0 &&
           (pvVar3 = plVar17->data, pvVar3 != (void *)0x0))) {
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar24 = true;
      }
    }
    if (!bVar24) goto LAB_0051f72b;
    cpu->exception_index = -1;
  }
  ptVar22 = (target_ulong_conflict *)0x0;
  ptVar8 = (target_ulong_conflict *)0x0;
  while( true ) {
    local_60 = ptVar8;
    pCVar23 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x1fea) = 0;
    uVar16 = cpu->interrupt_request;
    if (uVar16 != 0) {
      uVar21 = uVar16;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar21 = uVar16 & 0xffffeda5;
      }
      if ((char)uVar21 < '\0') {
        cpu->interrupt_request = uVar16 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_0051f233;
      }
      if ((uVar21 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_0051f233;
      }
      _Var9 = (*pCVar23->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar21);
      if (_Var9) {
        cpu->exception_index = -1;
        ptVar22 = (target_ulong_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        ptVar22 = (target_ulong_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    uVar16 = cpu->cflags_next_tb;
    if (uVar16 == 0xffffffff) {
      uVar16 = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    puVar2 = cpu->uc;
    env = (CPUARMState *)cpu->env_ptr;
    cpu_get_tb_cpu_state_arm(env,(target_ulong *)&local_70,&cs_base,&flags);
    uVar21 = local_70;
    uVar12 = tb_jmp_cache_hash_func(env->uc,(ulong)local_70);
    pTVar15 = cpu->tb_jmp_cache[uVar12];
    cf_mask = cpu->cluster_index << 0x18 | uVar16 & 0xffffff;
    if (((((pTVar15 == (TranslationBlock *)0x0) || ((uint)pTVar15->pc != uVar21)) ||
         (*(uint *)((long)&pTVar15->pc + 4) != (uint)cs_base)) ||
        (((uint32_t)pTVar15->cs_base != flags ||
         (uVar1._0_2_ = pTVar15->size, uVar1._2_2_ = pTVar15->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)))) || ((pTVar15->flags & 0xff0effff) != cf_mask)) {
      pTVar15 = tb_htable_lookup_arm(cpu,(ulong)uVar21,(ulong)(uint)cs_base,flags,cf_mask);
      if (pTVar15 == (TranslationBlock *)0x0) {
        pTVar15 = (TranslationBlock *)tb_gen_code_arm(cpu,local_70,(uint)cs_base,flags,uVar16);
        uVar16 = tb_jmp_cache_hash_func((uc_struct_conflict1 *)cpu->uc,(ulong)local_70);
        cpu->tb_jmp_cache[uVar16] = pTVar15;
        pTVar4 = puVar2->last_tb;
        if (pTVar4 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar15->pc;
          auVar25 = ZEXT416(*(uint *)((long)&pTVar15->cs_base + 4));
          auVar25 = pshuflw(auVar25,auVar25,0xe1);
          local_38 = auVar25._0_4_;
          local_50 = (ulong)(uint)pTVar4->pc;
          auVar25 = ZEXT416(*(uint *)((long)&pTVar4->cs_base + 4));
          auVar25 = pshuflw(auVar25,auVar25,0xe1);
          local_48 = auVar25._0_4_;
          plVar17 = (list_item *)(puVar2->hook + 0xf);
          while ((plVar17 = plVar17->next, plVar17 != (list_item *)0x0 &&
                 (pvVar3 = plVar17->data, pvVar3 != (void *)0x0))) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar18 = (ulong)(uint)pTVar15->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar18 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar18)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar12] = pTVar15;
      }
    }
    if ((ptVar22 != (target_ulong_conflict *)0x0) && (pTVar15->page_addr[0] == 0xffffffffffffffff))
    {
      if (1 < (uint)local_60) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar15->flags & 0x40000) == 0) {
        LOCK();
        bVar24 = *(long *)(ptVar22 + (long)local_60 * 2 + 0x20) == 0;
        if (bVar24) {
          *(TranslationBlock **)(ptVar22 + (long)local_60 * 2 + 0x20) = pTVar15;
        }
        UNLOCK();
        if (bVar24) {
          *(uint32_t *)(*(long *)(ptVar22 + (long)local_60 * 2 + 0x16) + *(long *)(ptVar22 + 6)) =
               (pTVar15->cflags -
               ((int)*(long *)(ptVar22 + (long)local_60 * 2 + 0x16) + (int)*(long *)(ptVar22 + 6)))
               + -4;
          *(uintptr_t *)(ptVar22 + (long)local_60 * 2 + 0x1c) = pTVar15->jmp_target_arg[1];
          pTVar15->jmp_target_arg[1] = (ulong)ptVar22 | (ulong)local_60;
        }
      }
    }
    ptVar8 = local_60;
    if (cpu->exit_request == false) {
      tVar13 = cpu_tb_exec(cpu,pTVar15);
      cpu->uc->last_tb = pTVar15;
      ptVar14 = (target_ulong_conflict *)(tVar13 & 0xfffffffffffffffc);
      uVar16 = (uint)tVar13 & 3;
      ptVar22 = ptVar14;
      ptVar8 = (target_ulong_conflict *)(ulong)uVar16;
      if (uVar16 == 3) {
        ptVar22 = (target_ulong_conflict *)0x0;
        ptStack_80 = (target_ulong_conflict *)0x3;
        ptVar8 = ptStack_80;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x3fd)) {
          lVar5 = cpu->icount_budget;
          lVar19 = 0xffff;
          if (lVar5 < 0xffff) {
            lVar19 = lVar5;
          }
          uVar16 = (uint)lVar19;
          *(short *)(cpu[1].tb_jmp_cache + 0x3fd) = (short)lVar19;
          cpu->icount_extra = lVar5 - (int)uVar16;
          ptVar22 = (target_ulong_conflict *)0x0;
          ptVar8 = (target_ulong_conflict *)0x3;
          if (0 < (int)uVar16 && lVar5 - (int)uVar16 == 0) {
            uVar21 = 0x7fff;
            if (uVar16 < 0x7fff) {
              uVar21 = uVar16;
            }
            pTVar15 = (TranslationBlock *)
                      tb_gen_code_arm(cpu,*ptVar14,ptVar14[1],ptVar14[2],uVar21 | 0x10000);
            (pTVar15->tc).size = (size_t)ptVar14;
            cpu_tb_exec(cpu,pTVar15);
            tb_phys_invalidate_arm
                      ((TCGContext_conflict *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar15,
                       0xffffffffffffffff);
            tcg_tb_remove_arm((TCGContext_conflict *)cpu->uc->tcg_ctx,pTVar15);
            ptVar22 = (target_ulong_conflict *)0x0;
            ptVar8 = (target_ulong_conflict *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_0051f233;
LAB_0051f72b:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
  goto LAB_0051f74d;
  while ((*(char *)((long)pvVar3 + 0x14) != '\0' ||
         (cVar10 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
         cVar10 == '\0'))) {
LAB_0051f6d1:
    plVar17 = plVar17->next;
    if ((plVar17 == (list_item *)0x0) || (pvVar3 = plVar17->data, pvVar3 == (void *)0x0)) {
      puVar2->invalid_error = 10;
      break;
    }
  }
LAB_0051f74d:
  uVar16 = 0x10001;
  pCVar23 = stack0xffffffffffffff98;
LAB_0051f757:
  local_58->cpu->tcg_exit_req = 0;
  (*pCVar23->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar16;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}